

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirmataDevice.cpp
# Opt level: O0

void remote_wiring::FirmataDevice::firmwareVersionCallback
               (void *context_,size_t sv_major_,size_t sv_minor_,char *firmware_)

{
  size_t sVar1;
  void *pvVar2;
  SemVer local_48;
  void *local_30;
  FirmataDevice *device;
  char *firmware__local;
  size_t sv_minor__local;
  size_t sv_major__local;
  void *context__local;
  
  local_30 = context_;
  device = (FirmataDevice *)firmware_;
  firmware__local = (char *)sv_minor_;
  sv_minor__local = sv_major_;
  sv_major__local = (size_t)context_;
  SemVer::SemVer(&local_48,sv_major_,sv_minor_,0);
  *(size_t *)((long)local_30 + 0x100) = local_48.sv_major;
  *(size_t *)((long)local_30 + 0x108) = local_48.sv_minor;
  *(size_t *)((long)local_30 + 0x110) = local_48.sv_patch;
  sVar1 = strlen((char *)device);
  pvVar2 = operator_new__(sVar1);
  *(void **)((long)local_30 + 0xf8) = pvVar2;
  strcpy(*(char **)((long)local_30 + 0xf8),(char *)device);
  (**(code **)((long)local_30 + 0x2b8))(*(undefined8 *)((long)local_30 + 0x18));
  return;
}

Assistant:

void
FirmataDevice::firmwareVersionCallback (
    void * context_,
    size_t sv_major_,
    size_t sv_minor_,
    const char * firmware_
) {
    FirmataDevice * device = static_cast<FirmataDevice *>(context_);
    device->_firmware_semantic_version = SemVer(sv_major_, sv_minor_, 0);

    // Duplicate description
    device->_firmware_name = new char[::strlen(firmware_)];
    ::strcpy(device->_firmware_name, firmware_);

    device->_uponAttach(device->_attach_context);
}